

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O2

void __thiscall Database::initIndex(Database *this)

{
  IndexTree *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> index_filename;
  
  std::operator+(&index_filename,&this->file_prefix,".index");
  this_00 = (IndexTree *)operator_new(0x38);
  IndexTree::IndexTree(this_00,&index_filename);
  this->index = this_00;
  std::__cxx11::string::~string((string *)&index_filename);
  return;
}

Assistant:

void Database::initIndex() {
    auto index_filename = file_prefix + ".index";
    index = new IndexTree(index_filename);
}